

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

Parser * __thiscall c4::yml::Parser::operator=(Parser *this,Parser *that)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  Parser *pPVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  csubstr cVar15;
  size_t local_98;
  size_t local_70;
  char msg [76];
  
  bVar14 = 0;
  _free(this);
  (this->m_options).flags = (that->m_options).flags;
  sVar8 = (that->m_file).len;
  (this->m_file).str = (that->m_file).str;
  (this->m_file).len = sVar8;
  sVar8 = (that->m_buf).len;
  (this->m_buf).str = (that->m_buf).str;
  (this->m_buf).len = sVar8;
  this->m_root_id = that->m_root_id;
  this->m_tree = that->m_tree;
  detail::stack<c4::yml::Parser::State,_16UL>::operator=(&this->m_stack,&that->m_stack);
  sVar8 = (this->m_stack).m_size;
  if (sVar8 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    msg._24_16_ = (undefined1  [16])
                  to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '\\';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_00231548)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar8 = (this->m_stack).m_size;
  }
  this->m_state = (this->m_stack).m_stack + (sVar8 - 1);
  sVar8 = that->m_key_tag2_indentation;
  this->m_key_tag_indentation = that->m_key_tag_indentation;
  this->m_key_tag2_indentation = sVar8;
  sVar8 = (that->m_key_tag).len;
  (this->m_key_tag).str = (that->m_key_tag).str;
  (this->m_key_tag).len = sVar8;
  sVar8 = (that->m_key_tag2).len;
  (this->m_key_tag2).str = (that->m_key_tag2).str;
  (this->m_key_tag2).len = sVar8;
  this->m_val_tag_indentation = that->m_val_tag_indentation;
  sVar8 = (that->m_val_tag).len;
  (this->m_val_tag).str = (that->m_val_tag).str;
  (this->m_val_tag).len = sVar8;
  this->m_key_anchor_was_before = that->m_key_anchor_was_before;
  this->m_key_anchor_indentation = that->m_key_anchor_indentation;
  sVar8 = (that->m_key_anchor).len;
  (this->m_key_anchor).str = (that->m_key_anchor).str;
  (this->m_key_anchor).len = sVar8;
  this->m_val_anchor_indentation = that->m_val_anchor_indentation;
  sVar8 = (that->m_val_anchor).len;
  (this->m_val_anchor).str = (that->m_val_anchor).str;
  (this->m_val_anchor).len = sVar8;
  sVar8 = (that->m_filter_arena).len;
  if (sVar8 != 0) {
    _resize_filter_arena(this,sVar8);
  }
  uVar11 = that->m_newline_offsets_capacity;
  uVar9 = this->m_newline_offsets_capacity;
  if (uVar9 < uVar11) {
    _resize_locations(this,uVar11);
    uVar9 = this->m_newline_offsets_capacity;
    uVar11 = that->m_newline_offsets_capacity;
  }
  if (uVar9 < uVar11) {
    pcVar12 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_capacity";
    pcVar13 = msg;
    for (lVar10 = 0x4c; lVar10 != 0; lVar10 = lVar10 + -1) {
      *pcVar13 = *pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar14 * -2 + 1;
      pcVar13 = pcVar13 + (ulong)bVar14 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar15.len;
    auVar4 = ZEXT1224(ZEXT412(0x6b36) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar15.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar15.str._4_4_;
    LVar3.name.len = local_70;
    (*p_Var1)(msg,0x4c,LVar3,(this->m_stack).m_callbacks.m_user_data);
    uVar9 = this->m_newline_offsets_capacity;
  }
  uVar11 = that->m_newline_offsets_size;
  if (uVar9 < uVar11) {
    pcVar12 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_size";
    pcVar13 = msg;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
      pcVar12 = pcVar12 + ((ulong)bVar14 * -2 + 1) * 8;
      pcVar13 = pcVar13 + (ulong)bVar14 * -0x10 + 8;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_98 = cVar15.len;
    auVar4 = ZEXT1224(ZEXT412(0x6b37) << 0x40);
    LVar5.name.str._0_4_ = (int)cVar15.str;
    LVar5.super_LineCol.offset = auVar4._0_8_;
    LVar5.super_LineCol.line = auVar4._8_8_;
    LVar5.super_LineCol.col = auVar4._16_8_;
    LVar5.name.str._4_4_ = cVar15.str._4_4_;
    LVar5.name.len = local_98;
    (*p_Var1)(msg,0x48,LVar5,(this->m_stack).m_callbacks.m_user_data);
    uVar11 = that->m_newline_offsets_size;
  }
  memcpy(this->m_newline_offsets,that->m_newline_offsets,uVar11 << 3);
  this->m_newline_offsets_size = that->m_newline_offsets_size;
  sVar8 = (that->m_newline_offsets_buf).len;
  (this->m_newline_offsets_buf).str = (that->m_newline_offsets_buf).str;
  (this->m_newline_offsets_buf).len = sVar8;
  return this;
}

Assistant:

Parser& Parser::operator=(Parser const& that)
{
    _free();
    m_options = (that.m_options);
    m_file = (that.m_file);
    m_buf = (that.m_buf);
    m_root_id = (that.m_root_id);
    m_tree = (that.m_tree);
    m_stack = that.m_stack;
    m_state = &m_stack.top();
    m_key_tag_indentation = (that.m_key_tag_indentation);
    m_key_tag2_indentation = (that.m_key_tag2_indentation);
    m_key_tag = (that.m_key_tag);
    m_key_tag2 = (that.m_key_tag2);
    m_val_tag_indentation = (that.m_val_tag_indentation);
    m_val_tag = (that.m_val_tag);
    m_key_anchor_was_before = (that.m_key_anchor_was_before);
    m_key_anchor_indentation = (that.m_key_anchor_indentation);
    m_key_anchor = (that.m_key_anchor);
    m_val_anchor_indentation = (that.m_val_anchor_indentation);
    m_val_anchor = (that.m_val_anchor);
    if(that.m_filter_arena.len > 0)
        _resize_filter_arena(that.m_filter_arena.len);
    if(that.m_newline_offsets_capacity > m_newline_offsets_capacity)
        _resize_locations(that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_size);
    memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
    m_newline_offsets_size = that.m_newline_offsets_size;
    m_newline_offsets_buf = that.m_newline_offsets_buf;
    return *this;
}